

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::emitPrototypeInputs(PrintC *this,FuncProto *proto)

{
  EmitXml *pEVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined8 uVar6;
  uint uVar7;
  string local_78;
  Atom local_58;
  long *plVar4;
  
  uVar2 = (*proto->store->_vptr_ProtoStore[5])();
  if (uVar2 == 0) {
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"void",0);
  }
  else if (0 < (int)uVar2) {
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        pEVar1 = (this->super_PrintLanguage).emit;
        (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
      }
      iVar3 = (*proto->store->_vptr_ProtoStore[6])(proto->store,(ulong)uVar7);
      plVar4 = (long *)CONCAT44(extraout_var,iVar3);
      lVar5 = (**(code **)(*plVar4 + 0x88))(plVar4);
      if (lVar5 == 0) {
        uVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6e])(this,uVar6,1);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
        local_58.type = blanktoken;
        local_58.highlight = no_color;
        local_58.name = &local_78;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        uVar6 = (**(code **)(*plVar4 + 0x18))(plVar4);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x6f])(this,uVar6);
        PrintLanguage::recurse(&this->super_PrintLanguage);
      }
      else {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[10])(this,lVar5);
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  if ((proto->flags & 1) != 0) {
    if (uVar2 != 0) {
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,",",8);
    }
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"...",8);
  }
  return;
}

Assistant:

void PrintC::emitPrototypeInputs(const FuncProto *proto)

{
  int4 sz = proto->numParams();
  
  if (sz == 0)
    emit->print("void",EmitXml::keyword_color);
  else {
    for(int4 i=0;i<sz;++i) {
      if (i!=0)
	emit->print(",");
      ProtoParameter *param = proto->getParam(i);
      Symbol *sym = param->getSymbol();
      if (sym != (Symbol *)0)
	emitVarDecl(sym);
      else {
	// Emit type without name, if there is no backing symbol
	pushTypeStart(param->getType(),true);
	pushAtom(Atom("",blanktoken,EmitXml::no_color));
	pushTypeEnd(param->getType());
	recurse();
      }
    }
  }
  if (proto->isDotdotdot()) {
    if (sz != 0)
      emit->print(",");
    emit->print("...");
  }
}